

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitArraySet(PrintExpressionContents *this,ArraySet *curr)

{
  ostream *stream;
  HeapType type;
  
  stream = this->o;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"array.set ",10);
  Colors::outputColorCode(stream,"\x1b[0m");
  type = wasm::Type::getHeapType(&curr->ref->type);
  PrintSExpression::printHeapTypeName(this->parent,type);
  return;
}

Assistant:

void visitArraySet(ArraySet* curr) {
    printMedium(o, "array.set ");
    printHeapTypeName(curr->ref->type.getHeapType());
  }